

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List * __thiscall
Am_Value_List::Append(Am_Value_List *this,Am_Value_List *other_list,bool unique)

{
  bool bVar1;
  Am_Value_List_Data *this_00;
  Am_Value *value;
  bool unique_local;
  Am_Value_List *other_list_local;
  Am_Value_List *this_local;
  
  if (this->data == (Am_Value_List_Data *)0x0) {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Start(other_list);
  while (bVar1 = Last(other_list), ((bVar1 ^ 0xffU) & 1) != 0) {
    value = Get(other_list);
    Add(this,value,Am_TAIL,false);
    Next(other_list);
  }
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::Append(Am_Value_List other_list, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();

  for (other_list.Start(); !other_list.Last(); other_list.Next())
    Add(other_list.Get(), Am_TAIL, false); //only need to make me unique once
  return *this;
}